

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

int fio_uuid_unlink(intptr_t uuid,void *obj)

{
  char *pcVar1;
  undefined1 *puVar2;
  char cVar3;
  undefined1 uVar4;
  byte bVar5;
  ulong uVar6;
  fio_data_s *pfVar7;
  fio_data_s *pfVar8;
  long lVar9;
  int *piVar10;
  undefined8 *puVar11;
  long lVar12;
  ulong uVar13;
  long *plVar14;
  int iVar15;
  void *pvVar16;
  ulong uVar17;
  undefined8 *puVar18;
  undefined8 *puVar19;
  long lVar20;
  uint uVar21;
  bool bVar22;
  fio_lock_i ret;
  timespec local_48;
  
  pfVar8 = fio_data;
  if ((uuid < 0) || (uVar21 = (uint)((ulong)uuid >> 8), fio_data->capa <= uVar21)) {
LAB_00106596:
    piVar10 = __errno_location();
    *piVar10 = 9;
    return -1;
  }
  lVar20 = (long)(int)uVar21 * 0xa8;
  if (*(char *)((long)fio_data + lVar20 + 0x6d) != (char)uuid) goto LAB_00106596;
  LOCK();
  pcVar1 = (char *)((long)fio_data + lVar20 + 0x6e);
  cVar3 = *pcVar1;
  *pcVar1 = '\x01';
  UNLOCK();
  local_48.tv_sec._0_1_ = cVar3;
  pfVar7 = fio_data;
  while (fio_data = pfVar7, (char)local_48.tv_sec != '\0') {
    local_48.tv_sec = 0;
    local_48.tv_nsec = 1;
    nanosleep(&local_48,(timespec *)0x0);
    LOCK();
    pcVar1 = (char *)((long)pfVar8 + lVar20 + 0x6e);
    cVar3 = *pcVar1;
    *pcVar1 = '\x01';
    UNLOCK();
    local_48.tv_sec._0_1_ = cVar3;
    pfVar7 = fio_data;
  }
  if ((pfVar7->capa <= uVar21) || (*(char *)((long)pfVar7 + lVar20 + 0x6d) != (char)uuid)) {
    LOCK();
    puVar2 = (undefined1 *)((long)pfVar7 + lVar20 + 0x6e);
    uVar4 = *puVar2;
    *puVar2 = 0;
    UNLOCK();
    local_48.tv_sec = CONCAT71(local_48.tv_sec._1_7_,uVar4);
    goto LAB_00106596;
  }
  iVar15 = -1;
  if (obj != (void *)0x0) {
    if (*(long *)((long)pfVar7 + lVar20 + 0xd8) == 0) {
LAB_00106515:
      puVar11 = (undefined8 *)0x0;
    }
    else {
      if ((*(char *)((long)pfVar7 + lVar20 + 0xe0) != '\0') &&
         (*(long *)((long)pfVar7 + lVar20 + 200) != *(long *)((long)pfVar7 + lVar20 + 0xb8))) {
        fio_uuid_links_rehash((fio_uuid_links_s *)((long)pfVar7 + lVar20 + 0xb8));
      }
      bVar5 = *(byte *)((long)pfVar7 + lVar20 + 0xe1);
      bVar22 = false;
      pvVar16 = (void *)0x0;
      if (bVar5 != 0) {
        pvVar16 = obj;
      }
      uVar13 = ~(-1L << (bVar5 & 0x3f));
      uVar17 = (ulong)pvVar16 ^ ((ulong)obj >> (bVar5 & 0x3f) | (long)obj << 0x40 - (bVar5 & 0x3f));
      lVar12 = *(long *)((long)pfVar7 + lVar20 + 0xd8);
      lVar9 = (uVar17 & uVar13) * 0x10;
      pvVar16 = *(void **)(lVar12 + lVar9);
      if (pvVar16 == obj || pvVar16 == (void *)0x0) {
        puVar11 = (undefined8 *)(lVar12 + lVar9);
      }
      else {
        uVar6 = *(ulong *)((long)pfVar7 + lVar20 + 0xc0);
        puVar11 = (undefined8 *)((uVar6 >> 2) * 0xb);
        puVar18 = (undefined8 *)0x420;
        if (uVar6 < 0x181) {
          puVar18 = puVar11;
        }
        puVar19 = (undefined8 *)0x0;
        while (bVar22 = puVar18 <= puVar19, !bVar22) {
          lVar9 = (uVar17 + 0xb + (long)puVar19 & uVar13) * 0x10;
          puVar11 = (undefined8 *)(lVar12 + lVar9);
          pvVar16 = *(void **)(lVar12 + lVar9);
          bVar22 = false;
          if ((pvVar16 == (void *)0x0) ||
             (puVar19 = (undefined8 *)((long)puVar19 + 0xb), pvVar16 == obj)) break;
        }
      }
      if (bVar22) goto LAB_00106515;
    }
    if ((puVar11 != (undefined8 *)0x0) &&
       (puVar18 = (undefined8 *)puVar11[1], puVar18 != (undefined8 *)0x0)) {
      plVar14 = (long *)((long)pfVar7 + lVar20 + 0xb8);
      *plVar14 = *plVar14 + -1;
      *puVar18 = 0;
      lVar12 = *(long *)((long)pfVar7 + lVar20 + 200);
      lVar9 = *(long *)((long)pfVar7 + lVar20 + 0xd0);
      if (puVar18 == (undefined8 *)(lVar9 + lVar12 * 0x10 + -0x10)) {
        *puVar11 = 0;
        plVar14 = (long *)(lVar12 * 0x10 + lVar9 + -0x20);
        do {
          if (lVar12 == 1) {
            lVar12 = 0;
            break;
          }
          lVar12 = lVar12 + -1;
          lVar9 = *plVar14;
          plVar14 = plVar14 + -2;
        } while (lVar9 == 0);
        *(long *)((long)pfVar7 + lVar20 + 200) = lVar12;
      }
      puVar11[1] = 0;
      iVar15 = 0;
      bVar22 = true;
      goto LAB_00106636;
    }
  }
  bVar22 = false;
LAB_00106636:
  if (!bVar22) {
    piVar10 = __errno_location();
    *piVar10 = 0x6b;
  }
  LOCK();
  *(undefined1 *)((long)fio_data + lVar20 + 0x6e) = 0;
  UNLOCK();
  return iVar15;
}

Assistant:

int fio_uuid_unlink(intptr_t uuid, void *obj) {
  if (!uuid_is_valid(uuid))
    goto invalid;
  fio_lock(&uuid_data(uuid).sock_lock);
  if (!uuid_is_valid(uuid))
    goto locked_invalid;
  /* default object comparison is always true */
  int ret =
      fio_uuid_links_remove(&uuid_data(uuid).links, (uintptr_t)obj, NULL, NULL);
  if (ret)
    errno = ENOTCONN;
  fio_unlock(&uuid_data(uuid).sock_lock);
  return ret;
locked_invalid:
  fio_unlock(&uuid_data(uuid).sock_lock);
invalid:
  errno = EBADF;
  return -1;
}